

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O1

int __thiscall CLineInput::OffsetFromDisplayToActual(CLineInput *this,int DisplayOffset)

{
  int iVar1;
  int cursor;
  int iVar2;
  int PrevOffset;
  bool bVar3;
  
  if (this->m_Hidden == true) {
    if (0 < DisplayOffset) {
      iVar1 = DisplayOffset + -1;
      cursor = 0;
      do {
        iVar2 = str_utf8_forward(this->m_pStr,cursor);
        bVar3 = iVar1 != 0;
        iVar1 = iVar1 + -1;
        if (iVar2 == cursor) {
          return iVar2;
        }
        cursor = iVar2;
      } while (bVar3);
      return iVar2;
    }
    DisplayOffset = 0;
  }
  return DisplayOffset;
}

Assistant:

int CLineInput::OffsetFromDisplayToActual(int DisplayOffset) const
{
	if(!IsHidden())
		return DisplayOffset;
	int ActualOffset = 0;
	for(int i = 0; i < DisplayOffset; i++)
	{
		const int PrevOffset = ActualOffset;
		ActualOffset = str_utf8_forward(m_pStr, ActualOffset);
		if(ActualOffset == PrevOffset)
			break;
	}
	return ActualOffset;
}